

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::noteLocalType(BinaryInstWriter *this,Type type,Index count)

{
  iterator __position;
  mapped_type *pmVar1;
  key_type local_28;
  Type type_local;
  
  local_28.id = type.id;
  pmVar1 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->numLocalsByType,&local_28);
  if (*pmVar1 == 0) {
    __position._M_current =
         (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&this->localTypes,__position,
                 &local_28);
    }
    else {
      (__position._M_current)->id = local_28.id;
      (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  *pmVar1 = *pmVar1 + (ulong)count;
  return;
}

Assistant:

void BinaryInstWriter::noteLocalType(Type type, Index count) {
  auto& num = numLocalsByType[type];
  if (num == 0) {
    localTypes.push_back(type);
  }
  num += count;
}